

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMapFileReader.cpp
# Opt level: O3

void __thiscall MILBlob::Blob::MMapFileReader::MMapFileReader(MMapFileReader *this,string *filename)

{
  int iVar1;
  pointer __p;
  FILE *__stream;
  pointer __p_00;
  runtime_error *prVar2;
  pointer ptVar3;
  stat fileInfo;
  _Any_data local_100;
  code *local_f0;
  code *local_e8;
  pointer local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  stat local_b8;
  
  *(undefined8 *)((long)&(this->m_dataSpan).m_ptr + 1) = 0;
  *(undefined8 *)((long)&(this->m_dataSpan).m_size.m_size + 1) = 0;
  (this->m_mmap)._M_t.super___uniq_ptr_impl<void,_std::function<void_(void_*)>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_std::function<void_(void_*)>_>.super__Head_base<0UL,_void_*,_false>
  ._M_head_impl = (void *)0x0;
  (this->m_dataSpan).m_ptr = (pointer)0x0;
  *(_Manager_type *)
   ((long)&(this->m_mmap)._M_t.super___uniq_ptr_impl<void,_std::function<void_(void_*)>_>._M_t.
           super__Tuple_impl<0UL,_void_*,_std::function<void_(void_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(void_*)>_>.
           super__Head_base<1UL,_std::function<void_(void_*)>,_false> + 0x10) = (_Manager_type)0x0;
  *(_Invoker_type *)
   ((long)&(this->m_mmap)._M_t.super___uniq_ptr_impl<void,_std::function<void_(void_*)>_>._M_t.
           super__Tuple_impl<0UL,_void_*,_std::function<void_(void_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(void_*)>_>.
           super__Head_base<1UL,_std::function<void_(void_*)>,_false> + 0x18) = (_Invoker_type)0x0;
  *(undefined8 *)
   &(this->m_mmap)._M_t.super___uniq_ptr_impl<void,_std::function<void_(void_*)>_>._M_t.
    super__Tuple_impl<0UL,_void_*,_std::function<void_(void_*)>_>.
    super__Tuple_impl<1UL,_std::function<void_(void_*)>_>.
    super__Head_base<1UL,_std::function<void_(void_*)>,_false> = 0;
  *(undefined8 *)
   ((long)&(this->m_mmap)._M_t.super___uniq_ptr_impl<void,_std::function<void_(void_*)>_>._M_t.
           super__Tuple_impl<0UL,_void_*,_std::function<void_(void_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(void_*)>_>.
           super__Head_base<1UL,_std::function<void_(void_*)>,_false> + 8) = 0;
  iVar1 = stat((filename->_M_dataplus)._M_p,&local_b8);
  if (iVar1 != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                   "Could not open ",filename);
    std::runtime_error::runtime_error(prVar2,(string *)local_100._M_pod_data);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __stream = fopen((filename->_M_dataplus)._M_p,"r");
  if (__stream != (FILE *)0x0) {
    iVar1 = fileno(__stream);
    __p_00 = (pointer)mmap((void *)0x0,local_b8.st_size,1,2,iVar1,0);
    local_e8 = std::
               _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/src/MILBlob/Blob/MMapFileReader.cpp:36:9)>
               ::_M_invoke;
    local_100._M_unused._M_member_pointer = local_b8.st_size;
    local_100._8_8_ = 0;
    local_f0 = std::
               _Function_handler<void_(void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/src/MILBlob/Blob/MMapFileReader.cpp:36:9)>
               ::_M_manager;
    if ((pointer)0x1 < __p_00 + 1) {
      ptVar3 = __p_00;
      if (local_b8.st_size == 0) {
        ptVar3 = (pointer)0x0;
      }
      (this->m_dataSpan).m_ptr = ptVar3;
      (this->m_dataSpan).m_size.m_size = local_b8.st_size;
      local_e0 = (pointer)0x0;
      std::__uniq_ptr_impl<void,_std::function<void_(void_*)>_>::reset
                ((__uniq_ptr_impl<void,_std::function<void_(void_*)>_> *)this,__p_00);
      std::function<void_(void_*)>::operator=
                ((function<void_(void_*)> *)this,(function<void_(void_*)> *)&local_100);
      std::unique_ptr<void,_std::function<void_(void_*)>_>::~unique_ptr
                ((unique_ptr<void,_std::function<void_(void_*)>_> *)&local_100);
      fclose(__stream);
      return;
    }
    local_e0 = __p_00;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_d8,"Unable to mmap file ",filename);
    std::runtime_error::runtime_error(prVar2,(string *)&local_d8);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 "Unable to read file ",filename);
  std::runtime_error::runtime_error(prVar2,(string *)local_100._M_pod_data);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

MMapFileReader::MMapFileReader(const std::string& filename) : m_isEncrypted(false)
{
    // verify file exists and find its length
    struct stat fileInfo;
    if (stat(filename.c_str(), &fileInfo) != 0) {
        throw std::runtime_error("Could not open " + filename);
    }

    // mmap works in size_t units to be compatible with virtual address space units
    auto fileLength = static_cast<size_t>(fileInfo.st_size);

    // wrap fopen/fclose in exception-safe type
    std::unique_ptr<FILE, decltype(&fclose)> f(fopen(filename.c_str(), "r"), fclose);

    MILVerifyIsTrue(f != nullptr, std::runtime_error, "Unable to read file " + filename);

    // wrap mmap/munmap in exception-safe type
    std::unique_ptr<void, std::function<void(void*)>> mmapPtr(
        mmap(nullptr, fileLength, PROT_READ, MAP_PRIVATE, fileno(f.get()), 0 /*offset*/),
        [length = fileLength](void* ptr) { munmap(ptr, length); });

    // NOLINTNEXTLINE(cppcoreguidelines-pro-type-cstyle-cast) -- MAP_FAILED is (void*) -1.
    MILVerifyIsTrue(mmapPtr.get() != nullptr && mmapPtr.get() != MAP_FAILED,
                    std::runtime_error,
                    "Unable to mmap file " + filename);

    m_dataSpan = Util::Span<uint8_t>(reinterpret_cast<uint8_t*>(mmapPtr.get()), fileLength);

    // Keep mmaping alive
    m_mmap = std::move(mmapPtr);
}